

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientImpl.cpp
# Opt level: O0

int __thiscall
SL::WS_LITE::WSClient_Configuration::connect
          (WSClient_Configuration *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  element_type *peVar1;
  PortNumber port;
  undefined4 in_register_00000034;
  long lVar2;
  byte in_R8B;
  string *in_R9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000008;
  shared_ptr<SL::WS_LITE::HubContext> local_90;
  unsigned_short local_7a;
  shared_ptr<SL::WS_LITE::HubContext> local_78;
  anon_class_1_0_00000001 local_65 [8];
  anon_class_1_0_00000001 createsocket_1;
  shared_ptr<SL::WS_LITE::HubContext> local_50;
  anon_class_1_0_00000001 local_39;
  string *psStack_38;
  anon_class_1_0_00000001 createsocket;
  string *endpoint_local;
  bool no_delay_local;
  string *host_local;
  WSClient_Configuration *this_local;
  PortNumber port_local;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  port.value = (unsigned_short)__len;
  psStack_38 = in_R9;
  peVar1 = std::
           __shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(lVar2 + 8));
  if ((peVar1->TLSEnabled & 1U) == 0) {
    std::shared_ptr<SL::WS_LITE::HubContext>::shared_ptr
              (&local_78,(shared_ptr<SL::WS_LITE::HubContext> *)(lVar2 + 8));
    local_7a = port.value;
    Connect<SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::__1&>
              (&local_78,(string *)__addr,port,(bool)(in_R8B & 1),local_65,psStack_38,
               in_stack_00000008);
    std::shared_ptr<SL::WS_LITE::HubContext>::~shared_ptr(&local_78);
  }
  else {
    std::shared_ptr<SL::WS_LITE::HubContext>::shared_ptr
              (&local_50,(shared_ptr<SL::WS_LITE::HubContext> *)(lVar2 + 8));
    Connect<SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::__0&>
              (&local_50,(string *)__addr,port,(bool)(in_R8B & 1),&local_39,psStack_38,
               in_stack_00000008);
    std::shared_ptr<SL::WS_LITE::HubContext>::~shared_ptr(&local_50);
  }
  std::make_shared<SL::WS_LITE::WSClient,std::shared_ptr<SL::WS_LITE::HubContext>&>(&local_90);
  std::shared_ptr<SL::WS_LITE::IWSHub>::shared_ptr<SL::WS_LITE::WSClient,void>
            ((shared_ptr<SL::WS_LITE::IWSHub> *)this,(shared_ptr<SL::WS_LITE::WSClient> *)&local_90)
  ;
  std::shared_ptr<SL::WS_LITE::WSClient>::~shared_ptr
            ((shared_ptr<SL::WS_LITE::WSClient> *)&local_90);
  return (int)this;
}

Assistant:

std::shared_ptr<IWSHub> WSClient_Configuration::connect(const std::string &host, PortNumber port, bool no_delay, const std::string &endpoint,
                                                            const std::unordered_map<std::string, std::string> &extraheaders)
    {
        if (Impl_->TLSEnabled) {
            auto createsocket = [](const std::shared_ptr<ThreadContext> &res) {
                return std::make_shared<WebSocket<false, asio::ssl::stream<asio::ip::tcp::socket>>>(res->WebSocketContext_, res->io_service,
                                                                                                    res->context);
            };
            Connect(Impl_, host, port, no_delay, createsocket, endpoint, extraheaders);
        }
        else {
            auto createsocket = [](const std::shared_ptr<ThreadContext> &res) {
                return std::make_shared<WebSocket<false, asio::ip::tcp::socket>>(res->WebSocketContext_, res->io_service);
            };
            Connect(Impl_, host, port, no_delay, createsocket, endpoint, extraheaders);
        }
        return std::make_shared<WSClient>(Impl_);
    }